

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
* __thiscall
deqp::gls::BuiltinPrecisionTests::
generateInputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,4,4>,tcu::Matrix<float,4,4>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>
          (Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
           *__return_storage_ptr__,BuiltinPrecisionTests *this,
          Samplings<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *samplings,FloatFormat *floatFormat,Precision intPrecision,size_t numSamples,Random *rnd)

{
  size_t *this_00;
  undefined8 uVar1;
  bool bVar2;
  size_type sVar3;
  reference in0_00;
  reference in1_00;
  reference in2_00;
  reference in3_00;
  undefined4 uVar4;
  undefined4 in_register_00000084;
  undefined1 local_2a8 [8];
  InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  tuple_1;
  In3 in3;
  In2 in2;
  In1 in1;
  In0 in0;
  size_t ndx;
  undefined1 local_184 [8];
  InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  tuple;
  size_t ndx3;
  size_t ndx2;
  size_t ndx1;
  size_t ndx0;
  undefined1 local_d0 [8];
  set<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>,_deqp::gls::BuiltinPrecisionTests::InputLess<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>,_std::allocator<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>_>
  seenInputs;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  fixedInputs;
  Random *rnd_local;
  size_t numSamples_local;
  Precision intPrecision_local;
  FloatFormat *floatFormat_local;
  Samplings<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *samplings_local;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *ret;
  
  uVar4 = SUB84(floatFormat,0);
  fixedInputs.in3.
  super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  ::Inputs(__return_storage_ptr__);
  this_00 = &seenInputs._M_t._M_impl.super__Rb_tree_header._M_node_count;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  ::Inputs((Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
            *)this_00);
  std::
  set<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>,_deqp::gls::BuiltinPrecisionTests::InputLess<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>,_std::allocator<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>_>
  ::set((set<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>,_deqp::gls::BuiltinPrecisionTests::InputLess<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>,_std::allocator<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>_>
         *)local_d0);
  (**(code **)**(undefined8 **)this)(*(undefined8 **)this,samplings,this_00);
  (**(code **)**(undefined8 **)(this + 8))
            (*(undefined8 **)(this + 8),samplings,
             &fixedInputs.in0.
              super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  (**(code **)**(undefined8 **)(this + 0x10))
            (*(undefined8 **)(this + 0x10),samplings,
             &fixedInputs.in1.
              super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  (**(code **)**(undefined8 **)(this + 0x18))
            (*(undefined8 **)(this + 0x18),samplings,
             &fixedInputs.in2.
              super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  for (ndx1 = 0;
      sVar3 = std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
              size((vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> *)
                   &seenInputs._M_t._M_impl.super__Rb_tree_header._M_node_count), ndx1 < sVar3;
      ndx1 = ndx1 + 1) {
    for (ndx2 = 0;
        sVar3 = std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
                size((vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> *
                     )&fixedInputs.in0.
                       super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage), ndx2 < sVar3;
        ndx2 = ndx2 + 1) {
      for (ndx3 = 0;
          sVar3 = std::
                  vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                  ::size((vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                          *)&fixedInputs.in1.
                             super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage), ndx3 < sVar3;
          ndx3 = ndx3 + 1) {
        tuple.
        super_Tuple4<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>
        .b.m_data.m_data[3].m_data[3] = 0.0;
        tuple.
        super_Tuple4<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>
        ._128_4_ = 0;
        for (; uVar1 = tuple.
                       super_Tuple4<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>
                       ._124_8_,
            sVar3 = std::
                    vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                    ::size((vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                            *)&fixedInputs.in2.
                               super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage),
            (ulong)uVar1 < sVar3;
            tuple.
            super_Tuple4<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>
            ._124_8_ = tuple.
                       super_Tuple4<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>
                       ._124_8_ + 1) {
          in0_00 = std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                   ::operator[]((vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                                 *)&seenInputs._M_t._M_impl.super__Rb_tree_header._M_node_count,ndx1
                               );
          in1_00 = std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                   ::operator[]((vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                                 *)&fixedInputs.in0.
                                    super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,ndx2);
          in2_00 = std::
                   vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                   ::operator[]((vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                                 *)&fixedInputs.in1.
                                    super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,ndx3);
          in3_00 = std::
                   vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                   ::operator[]((vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                                 *)&fixedInputs.in2.
                                    super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                tuple.
                                super_Tuple4<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>
                                ._124_8_);
          InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          ::InTuple((InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
                     *)local_184,in0_00,in1_00,in2_00,in3_00);
          std::
          set<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>,_deqp::gls::BuiltinPrecisionTests::InputLess<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>,_std::allocator<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>_>
          ::insert((set<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>,_deqp::gls::BuiltinPrecisionTests::InputLess<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>,_std::allocator<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>_>
                    *)local_d0,(value_type *)local_184);
          std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
          push_back(&__return_storage_ptr__->in0,(value_type *)local_184);
          std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
          push_back(&__return_storage_ptr__->in1,
                    (value_type *)
                    (tuple.
                     super_Tuple4<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>
                     .a.m_data.m_data[3].m_data + 2));
          std::
          vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
          ::push_back(&__return_storage_ptr__->in2,
                      (value_type *)
                      (tuple.
                       super_Tuple4<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>
                       .b.m_data.m_data[3].m_data + 2));
          std::
          vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
          ::push_back(&__return_storage_ptr__->in3,
                      (value_type *)
                      ((long)tuple.
                             super_Tuple4<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>
                             .b.m_data.m_data[3].m_data + 9));
          InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          ::~InTuple((InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
                      *)local_184);
        }
      }
    }
  }
  in0.m_data.m_data[3].m_data[2] = 0.0;
  in0.m_data.m_data[3].m_data[3] = 0.0;
  for (; (ulong)in0.m_data.m_data[3].m_data._8_8_ < CONCAT44(in_register_00000084,intPrecision);
      in0.m_data.m_data[3].m_data._8_8_ = in0.m_data.m_data[3].m_data._8_8_ + 1) {
    (**(code **)(**(long **)this + 8))
              (in1.m_data.m_data[3].m_data + 2,*(long **)this,samplings,uVar4,numSamples);
    (**(code **)(**(long **)(this + 8) + 8))
              (&tuple_1.
                super_Tuple4<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>
                .field_0x80,*(long **)(this + 8),samplings,uVar4,numSamples);
    (**(code **)(**(long **)(this + 0x10) + 8))(*(long **)(this + 0x10),samplings,uVar4,numSamples);
    (**(code **)(**(long **)(this + 0x18) + 8))(*(long **)(this + 0x18),samplings,uVar4,numSamples);
    InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
    ::InTuple((InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
               *)local_2a8,(In0 *)(in1.m_data.m_data[3].m_data + 2),
              (In1 *)&tuple_1.
                      super_Tuple4<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>
                      .field_0x80,
              (In2 *)((long)tuple_1.
                            super_Tuple4<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>
                            .b.m_data.m_data[3].m_data + 0xf),
              (In3 *)((long)tuple_1.
                            super_Tuple4<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>
                            .b.m_data.m_data[3].m_data + 0xd));
    bVar2 = de::
            contains<std::set<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,4,4>,tcu::Matrix<float,4,4>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>,deqp::gls::BuiltinPrecisionTests::InputLess<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,4,4>,tcu::Matrix<float,4,4>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>>,std::allocator<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,4,4>,tcu::Matrix<float,4,4>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>>>>
                      ((set<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>,_deqp::gls::BuiltinPrecisionTests::InputLess<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>,_std::allocator<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>_>
                        *)local_d0,(key_type *)local_2a8);
    if (!bVar2) {
      std::
      set<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>,_deqp::gls::BuiltinPrecisionTests::InputLess<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>,_std::allocator<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>_>
      ::insert((set<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>,_deqp::gls::BuiltinPrecisionTests::InputLess<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>,_std::allocator<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>_>
                *)local_d0,(value_type *)local_2a8);
      std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::push_back
                (&__return_storage_ptr__->in0,(value_type *)(in1.m_data.m_data[3].m_data + 2));
      std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::push_back
                (&__return_storage_ptr__->in1,
                 (value_type *)
                 &tuple_1.
                  super_Tuple4<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>
                  .field_0x80);
      std::
      vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
      ::push_back(&__return_storage_ptr__->in2,
                  (value_type *)
                  ((long)tuple_1.
                         super_Tuple4<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>
                         .b.m_data.m_data[3].m_data + 0xf));
      std::
      vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
      ::push_back(&__return_storage_ptr__->in3,
                  (value_type *)
                  ((long)tuple_1.
                         super_Tuple4<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>
                         .b.m_data.m_data[3].m_data + 0xd));
    }
    InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
    ::~InTuple((InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
                *)local_2a8);
    tcu::Matrix<float,_4,_4>::~Matrix
              ((Matrix<float,_4,_4> *)
               &tuple_1.
                super_Tuple4<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>
                .field_0x80);
    tcu::Matrix<float,_4,_4>::~Matrix((Matrix<float,_4,_4> *)(in1.m_data.m_data[3].m_data + 2));
  }
  fixedInputs.in3.
  super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  std::
  set<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>,_deqp::gls::BuiltinPrecisionTests::InputLess<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>,_std::allocator<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>_>
  ::~set((set<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>,_deqp::gls::BuiltinPrecisionTests::InputLess<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>,_std::allocator<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>_>
          *)local_d0);
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  ::~Inputs((Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
             *)&seenInputs._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if ((fixedInputs.in3.
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
    ::~Inputs(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Inputs<In> generateInputs (const Samplings<In>&	samplings,
						   const FloatFormat&	floatFormat,
						   Precision			intPrecision,
						   size_t				numSamples,
						   Random&				rnd)
{
	Inputs<In>									ret;
	Inputs<In>									fixedInputs;
	set<InTuple<In>, InputLess<InTuple<In> > >	seenInputs;

	samplings.in0.genFixeds(floatFormat, fixedInputs.in0);
	samplings.in1.genFixeds(floatFormat, fixedInputs.in1);
	samplings.in2.genFixeds(floatFormat, fixedInputs.in2);
	samplings.in3.genFixeds(floatFormat, fixedInputs.in3);

	for (size_t ndx0 = 0; ndx0 < fixedInputs.in0.size(); ++ndx0)
	{
		for (size_t ndx1 = 0; ndx1 < fixedInputs.in1.size(); ++ndx1)
		{
			for (size_t ndx2 = 0; ndx2 < fixedInputs.in2.size(); ++ndx2)
			{
				for (size_t ndx3 = 0; ndx3 < fixedInputs.in3.size(); ++ndx3)
				{
					const InTuple<In>	tuple	(fixedInputs.in0[ndx0],
												 fixedInputs.in1[ndx1],
												 fixedInputs.in2[ndx2],
												 fixedInputs.in3[ndx3]);

					seenInputs.insert(tuple);
					ret.in0.push_back(tuple.a);
					ret.in1.push_back(tuple.b);
					ret.in2.push_back(tuple.c);
					ret.in3.push_back(tuple.d);
				}
			}
		}
	}

	for (size_t ndx = 0; ndx < numSamples; ++ndx)
	{
		const typename In::In0	in0		= samplings.in0.genRandom(floatFormat, intPrecision, rnd);
		const typename In::In1	in1		= samplings.in1.genRandom(floatFormat, intPrecision, rnd);
		const typename In::In2	in2		= samplings.in2.genRandom(floatFormat, intPrecision, rnd);
		const typename In::In3	in3		= samplings.in3.genRandom(floatFormat, intPrecision, rnd);
		const InTuple<In>		tuple	(in0, in1, in2, in3);

		if (de::contains(seenInputs, tuple))
			continue;

		seenInputs.insert(tuple);
		ret.in0.push_back(in0);
		ret.in1.push_back(in1);
		ret.in2.push_back(in2);
		ret.in3.push_back(in3);
	}

	return ret;
}